

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O2

void __thiscall kj::_::anon_unknown_0::TestCase168::run(TestCase168 *this)

{
  bool result;
  byte bVar1;
  bool bVar2;
  DebugComparison<kj::Maybe<double>,_double> _kjCondition;
  undefined1 local_58 [8];
  size_t local_50;
  Array<char> local_48;
  
  local_58 = (undefined1  [8])0x1b1880;
  local_50 = 2;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.result = (bool)(-((double)local_48.size_ == 0.0) & 1);
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  else {
    _kjCondition.result = false;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = 0.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<double>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xa9,ERROR,
               "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<double>() == 0.0\", _kjCondition",
               (char (*) [52])"failed: expected \"0\"_kj.tryParseAs<double>() == 0.0",&_kjCondition)
    ;
  }
  local_58 = (undefined1  [8])0x1b1880;
  local_50 = 2;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.result = (bool)(-((double)local_48.size_ == 0.0) & 1);
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  else {
    _kjCondition.result = false;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = 0.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<double>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xaa,ERROR,
               "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<double>() == 0.0\", _kjCondition",
               (char (*) [52])"failed: expected \"0\"_kj.tryParseAs<double>() == 0.0",&_kjCondition)
    ;
  }
  local_58 = (undefined1  [8])0x1afded;
  local_50 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.result = (bool)(-((double)local_48.size_ == 0.0) & 1);
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  else {
    _kjCondition.result = false;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = 0.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[54],kj::_::DebugComparison<kj::Maybe<double>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xab,ERROR,
               "\"failed: expected \" \"\\\"0.0\\\"_kj.tryParseAs<double>() == 0.0\", _kjCondition",
               (char (*) [54])"failed: expected \"0.0\"_kj.tryParseAs<double>() == 0.0",
               &_kjCondition);
  }
  local_58 = (undefined1  [8])0x1bf183;
  local_50 = 2;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.result = (bool)(-((double)local_48.size_ == 1.0) & 1);
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  else {
    _kjCondition.result = false;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = 1.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<double>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xac,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<double>() == 1.0\", _kjCondition",
               (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<double>() == 1.0",&_kjCondition)
    ;
  }
  local_58 = (undefined1  [8])0x1affd1;
  local_50 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.result = (bool)(-((double)local_48.size_ == 1.0) & 1);
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  else {
    _kjCondition.result = false;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = 1.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[54],kj::_::DebugComparison<kj::Maybe<double>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xad,ERROR,
               "\"failed: expected \" \"\\\"1.0\\\"_kj.tryParseAs<double>() == 1.0\", _kjCondition",
               (char (*) [54])"failed: expected \"1.0\"_kj.tryParseAs<double>() == 1.0",
               &_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b007b;
  local_50 = 6;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.result = (bool)(-((double)local_48.size_ == 1e+100) & 1);
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  else {
    _kjCondition.result = false;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = 1e+100;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xae,ERROR,
               "\"failed: expected \" \"\\\"1e100\\\"_kj.tryParseAs<double>() == 1e100\", _kjCondition"
               ,(char (*) [58])"failed: expected \"1e100\"_kj.tryParseAs<double>() == 1e100",
               &_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b043c;
  local_50 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == 1;
  if (bVar2) {
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  _kjCondition.result = bVar2 && INFINITY <= (double)local_48.size_;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || INFINITY > (double)local_48.size_) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xaf,ERROR,
               "\"failed: expected \" \"\\\"inf\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
               ,(char (*) [56])"failed: expected \"inf\"_kj.tryParseAs<double>() == inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b04f1;
  local_50 = 9;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == 1;
  if (bVar2) {
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  _kjCondition.result = bVar2 && INFINITY <= (double)local_48.size_;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || INFINITY > (double)local_48.size_) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb0,ERROR,
               "\"failed: expected \" \"\\\"infinity\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
               ,(char (*) [61])"failed: expected \"infinity\"_kj.tryParseAs<double>() == inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b05ba;
  local_50 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == 1;
  if (bVar2) {
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  _kjCondition.result = bVar2 && INFINITY <= (double)local_48.size_;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || INFINITY > (double)local_48.size_) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb1,ERROR,
               "\"failed: expected \" \"\\\"INF\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
               ,(char (*) [56])"failed: expected \"INF\"_kj.tryParseAs<double>() == inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b066f;
  local_50 = 9;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == 1;
  if (bVar2) {
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  _kjCondition.result = bVar2 && INFINITY <= (double)local_48.size_;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || INFINITY > (double)local_48.size_) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb2,ERROR,
               "\"failed: expected \" \"\\\"INFINITY\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
               ,(char (*) [61])"failed: expected \"INFINITY\"_kj.tryParseAs<double>() == inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b0738;
  local_50 = 9;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == 1;
  if (bVar2) {
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  _kjCondition.result = bVar2 && INFINITY <= (double)local_48.size_;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || INFINITY > (double)local_48.size_) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb3,ERROR,
               "\"failed: expected \" \"\\\"1e100000\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
               ,(char (*) [61])"failed: expected \"1e100000\"_kj.tryParseAs<double>() == inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b043b;
  local_50 = 5;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == 1;
  if (bVar2) {
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  _kjCondition.result = bVar2 && (double)local_48.size_ <= -INFINITY;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (double)local_48.size_ > -INFINITY) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb4,ERROR,
               "\"failed: expected \" \"\\\"-inf\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
               ,(char (*) [58])"failed: expected \"-inf\"_kj.tryParseAs<double>() == -inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b04f0;
  local_50 = 10;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == 1;
  if (bVar2) {
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  _kjCondition.result = bVar2 && (double)local_48.size_ <= -INFINITY;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (double)local_48.size_ > -INFINITY) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb5,ERROR,
               "\"failed: expected \" \"\\\"-infinity\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
               ,(char (*) [63])"failed: expected \"-infinity\"_kj.tryParseAs<double>() == -inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b05b9;
  local_50 = 5;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == 1;
  if (bVar2) {
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  _kjCondition.result = bVar2 && (double)local_48.size_ <= -INFINITY;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (double)local_48.size_ > -INFINITY) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb6,ERROR,
               "\"failed: expected \" \"\\\"-INF\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
               ,(char (*) [58])"failed: expected \"-INF\"_kj.tryParseAs<double>() == -inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b066e;
  local_50 = 10;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == 1;
  if (bVar2) {
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  _kjCondition.result = bVar2 && (double)local_48.size_ <= -INFINITY;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (double)local_48.size_ > -INFINITY) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb7,ERROR,
               "\"failed: expected \" \"\\\"-INFINITY\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
               ,(char (*) [63])"failed: expected \"-INFINITY\"_kj.tryParseAs<double>() == -inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b0737;
  local_50 = 10;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == 1;
  if (bVar2) {
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  _kjCondition.result = bVar2 && (double)local_48.size_ <= -INFINITY;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (double)local_48.size_ > -INFINITY) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb8,ERROR,
               "\"failed: expected \" \"\\\"-1e100000\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
               ,(char (*) [63])"failed: expected \"-1e100000\"_kj.tryParseAs<double>() == -inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b0800;
  local_50 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  _kjCondition.left.ptr.isSet = (bool)(NAN((double)local_48.size_) & (byte)local_48.ptr);
  _kjCondition.left.ptr._1_1_ = 1;
  _kjCondition.left.ptr.field_1.value = (double)anon_var_dwarf_1b07e;
  _kjCondition.right = 2.47032822920623e-323;
  _kjCondition.op.content.ptr =
       (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,_kjCondition.left.ptr.isSet);
  if ((_kjCondition.left.ptr.isSet == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[77],kj::_::DebugComparison<bool,bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb9,ERROR,
               "\"failed: expected \" \"isNaN(\\\"nan\\\"_kj.tryParseAs<double>().orDefault(0.0)) == true\", _kjCondition"
               ,(char (*) [77])
                "failed: expected isNaN(\"nan\"_kj.tryParseAs<double>().orDefault(0.0)) == true",
               (DebugComparison<bool,_bool> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b087f;
  local_50 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  _kjCondition.left.ptr.isSet = (bool)(NAN((double)local_48.size_) & (byte)local_48.ptr);
  _kjCondition.left.ptr._1_1_ = 1;
  _kjCondition.left.ptr.field_1.value = (double)anon_var_dwarf_1b07e;
  _kjCondition.right = 2.47032822920623e-323;
  _kjCondition.op.content.ptr =
       (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,_kjCondition.left.ptr.isSet);
  if ((_kjCondition.left.ptr.isSet == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[77],kj::_::DebugComparison<bool,bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xba,ERROR,
               "\"failed: expected \" \"isNaN(\\\"NAN\\\"_kj.tryParseAs<double>().orDefault(0.0)) == true\", _kjCondition"
               ,(char (*) [77])
                "failed: expected isNaN(\"NAN\"_kj.tryParseAs<double>().orDefault(0.0)) == true",
               (DebugComparison<bool,_bool> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b08fe;
  local_50 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  _kjCondition.left.ptr.isSet = (bool)(NAN((double)local_48.size_) & (byte)local_48.ptr);
  _kjCondition.left.ptr._1_1_ = 1;
  _kjCondition.left.ptr.field_1.value = (double)anon_var_dwarf_1b07e;
  _kjCondition.right = 2.47032822920623e-323;
  _kjCondition.op.content.ptr =
       (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,_kjCondition.left.ptr.isSet);
  if ((_kjCondition.left.ptr.isSet == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[77],kj::_::DebugComparison<bool,bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbb,ERROR,
               "\"failed: expected \" \"isNaN(\\\"NaN\\\"_kj.tryParseAs<double>().orDefault(0.0)) == true\", _kjCondition"
               ,(char (*) [77])
                "failed: expected isNaN(\"NaN\"_kj.tryParseAs<double>().orDefault(0.0)) == true",
               (DebugComparison<bool,_bool> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1cf111;
  local_50 = 1;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1.value = (double)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbc,ERROR,
               "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
               ,(char (*) [56])"failed: expected \"\"_kj.tryParseAs<double>() == kj::none",
               (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b61e3;
  local_50 = 2;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbd,ERROR,
               "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
               ,(char (*) [57])"failed: expected \"a\"_kj.tryParseAs<double>() == kj::none",
               (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b2ca7;
  local_50 = 3;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbe,ERROR,
               "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
               ,(char (*) [58])"failed: expected \"1a\"_kj.tryParseAs<double>() == kj::none",
               (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b2caa;
  local_50 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbf,ERROR,
               "\"failed: expected \" \"\\\"+-1\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
               ,(char (*) [59])"failed: expected \"+-1\"_kj.tryParseAs<double>() == kj::none",
               (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<float>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar1 = -((float)local_58._4_4_ == 1.0) & 1;
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
  }
  else {
    bVar1 = 0;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr.field_1.value = 1.0;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar1);
  if ((bVar1 == 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<float>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc1,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<float>() == 1.0\", _kjCondition",
               (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<float>() == 1.0",
               (DebugComparison<kj::Maybe<float>,_double> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1bf183;
  local_50 = 2;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc3,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int64_t>() == 1\", _kjCondition",
               (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<int64_t>() == 1",
               (DebugComparison<kj::Maybe<long>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b0d24;
  local_50 = 0x14;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x7fffffffffffffff;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = NAN;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x7fffffffffffffff) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<long>,long_long>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc4,ERROR,
               "\"failed: expected \" \"\\\"9223372036854775807\\\"_kj.tryParseAs<int64_t>() == 9223372036854775807LL\", _kjCondition"
               ,(char (*) [89])
                "failed: expected \"9223372036854775807\"_kj.tryParseAs<int64_t>() == 9223372036854775807LL"
               ,(DebugComparison<kj::Maybe<long>,_long_long> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1af0be;
  local_50 = 0x15;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x8000000000000000;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = -0.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x8000000000000000) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[92],kj::_::DebugComparison<kj::Maybe<long>,unsigned_long_long>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc5,ERROR,
               "\"failed: expected \" \"\\\"-9223372036854775808\\\"_kj.tryParseAs<int64_t>() == -9223372036854775808ULL\", _kjCondition"
               ,(char (*) [92])
                "failed: expected \"-9223372036854775808\"_kj.tryParseAs<int64_t>() == -9223372036854775808ULL"
               ,(DebugComparison<kj::Maybe<long>,_unsigned_long_long> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1af0bf;
  local_50 = 0x14;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[76],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc6,ERROR,
               "\"failed: expected \" \"\\\"9223372036854775808\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [76])
                "failed: expected \"9223372036854775808\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b2cae;
  local_50 = 0x15;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[77],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,199,ERROR,
               "\"failed: expected \" \"\\\"-9223372036854775809\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [77])
                "failed: expected \"-9223372036854775809\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1cf111;
  local_50 = 1;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,200,ERROR,
               "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [57])"failed: expected \"\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b61e3;
  local_50 = 2;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc9,ERROR,
               "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [58])"failed: expected \"a\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b2ca7;
  local_50 = 3;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xca,ERROR,
               "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [59])"failed: expected \"1a\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b2caa;
  local_50 = 4;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xcb,ERROR,
               "\"failed: expected \" \"\\\"+-1\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected \"+-1\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b1567;
  local_50 = 4;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xa;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,10);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xa) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[54],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xcc,ERROR,
               "\"failed: expected \" \"\\\"010\\\"_kj.tryParseAs<int64_t>() == 10\", _kjCondition",
               (char (*) [54])"failed: expected \"010\"_kj.tryParseAs<int64_t>() == 10",
               (DebugComparison<kj::Maybe<long>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b136c;
  local_50 = 5;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xa;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,10);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xa) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xcd,ERROR,
               "\"failed: expected \" \"\\\"0010\\\"_kj.tryParseAs<int64_t>() == 10\", _kjCondition"
               ,(char (*) [55])"failed: expected \"0010\"_kj.tryParseAs<int64_t>() == 10",
               (DebugComparison<kj::Maybe<long>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b1616;
  local_50 = 5;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x10;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x10);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x10) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xce,ERROR,
               "\"failed: expected \" \"\\\"0x10\\\"_kj.tryParseAs<int64_t>() == 16\", _kjCondition"
               ,(char (*) [55])"failed: expected \"0x10\"_kj.tryParseAs<int64_t>() == 16",
               (DebugComparison<kj::Maybe<long>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b16c9;
  local_50 = 5;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x10;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x10);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x10) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xcf,ERROR,
               "\"failed: expected \" \"\\\"0X10\\\"_kj.tryParseAs<int64_t>() == 16\", _kjCondition"
               ,(char (*) [55])"failed: expected \"0X10\"_kj.tryParseAs<int64_t>() == 16",
               (DebugComparison<kj::Maybe<long>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b1566;
  local_50 = 5;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xfffffffffffffff6;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xfffffff6);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xfffffffffffffff6) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd0,ERROR,
               "\"failed: expected \" \"\\\"-010\\\"_kj.tryParseAs<int64_t>() == -10\", _kjCondition"
               ,(char (*) [56])"failed: expected \"-010\"_kj.tryParseAs<int64_t>() == -10",
               (DebugComparison<kj::Maybe<long>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b1615;
  local_50 = 6;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xfffffffffffffff0;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xfffffff0);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xfffffffffffffff0) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd1,ERROR,
               "\"failed: expected \" \"\\\"-0x10\\\"_kj.tryParseAs<int64_t>() == -16\", _kjCondition"
               ,(char (*) [57])"failed: expected \"-0x10\"_kj.tryParseAs<int64_t>() == -16",
               (DebugComparison<kj::Maybe<long>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b16c8;
  local_50 = 6;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xfffffffffffffff0;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xfffffff0);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xfffffffffffffff0) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd2,ERROR,
               "\"failed: expected \" \"\\\"-0X10\\\"_kj.tryParseAs<int64_t>() == -16\", _kjCondition"
               ,(char (*) [57])"failed: expected \"-0X10\"_kj.tryParseAs<int64_t>() == -16",
               (DebugComparison<kj::Maybe<long>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1bf183;
  local_50 = 2;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd4,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint64_t>() == 1\", _kjCondition",
               (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<uint64_t>() == 1",
               (DebugComparison<kj::Maybe<unsigned_long>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b1880;
  local_50 = 2;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x0;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)((ulong)_kjCondition.right & 0xffffffff00000000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x0) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd5,ERROR,
               "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<uint64_t>() == 0\", _kjCondition",
               (char (*) [52])"failed: expected \"0\"_kj.tryParseAs<uint64_t>() == 0",
               (DebugComparison<kj::Maybe<unsigned_long>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b18b7;
  local_50 = 0x15;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xffffffffffffffff;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = -NAN;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xffffffffffffffff) &&
     (Debug::minSeverity < 3)) {
    Debug::
    log<char_const(&)[93],kj::_::DebugComparison<kj::Maybe<unsigned_long>,unsigned_long_long>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd6,ERROR,
               "\"failed: expected \" \"\\\"18446744073709551615\\\"_kj.tryParseAs<uint64_t>() == 18446744073709551615ULL\", _kjCondition"
               ,(char (*) [93])
                "failed: expected \"18446744073709551615\"_kj.tryParseAs<uint64_t>() == 18446744073709551615ULL"
               ,(DebugComparison<kj::Maybe<unsigned_long>,_unsigned_long_long> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1a8809;
  local_50 = 3;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd7,ERROR,
               "\"failed: expected \" \"\\\"-1\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected \"-1\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b2cc3;
  local_50 = 0x15;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[78],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd8,ERROR,
               "\"failed: expected \" \"\\\"18446744073709551616\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [78])
                "failed: expected \"18446744073709551616\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1cf111;
  local_50 = 1;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd9,ERROR,
               "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [58])"failed: expected \"\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b61e3;
  local_50 = 2;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xda,ERROR,
               "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [59])"failed: expected \"a\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b2ca7;
  local_50 = 3;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xdb,ERROR,
               "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected \"1a\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1b2caa;
  local_50 = 4;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_48);
  if ((byte)local_48.ptr == 1) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.result = (bool)((byte)local_48.ptr ^ 1);
  _kjCondition.right = (double)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((byte)local_48.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xdc,ERROR,
               "\"failed: expected \" \"\\\"+-1\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [61])"failed: expected \"+-1\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<int>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58._4_4_ == 1;
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr.field_1._0_4_ = 1;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<int>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xde,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int32_t>() == 1\", _kjCondition",
               (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<int32_t>() == 1",
               (DebugComparison<kj::Maybe<int>,_int> *)&_kjCondition);
  }
  local_48.ptr = "2147483647";
  local_48.size_ = 0xb;
  StringPtr::tryParseAs<int>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58._4_4_ == 0x7fffffff;
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr.field_1._0_4_ = 0x7fffffff;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[69],kj::_::DebugComparison<kj::Maybe<int>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xdf,ERROR,
               "\"failed: expected \" \"\\\"2147483647\\\"_kj.tryParseAs<int32_t>() == 2147483647\", _kjCondition"
               ,(char (*) [69])
                "failed: expected \"2147483647\"_kj.tryParseAs<int32_t>() == 2147483647",
               (DebugComparison<kj::Maybe<int>,_int> *)&_kjCondition);
  }
  local_48.ptr = "-2147483648";
  local_48.size_ = 0xc;
  StringPtr::tryParseAs<int>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr.field_1.value = -NAN;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = _kjCondition.op.content.size_ & 0xffffffffffffff00;
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[71],kj::_::DebugComparison<kj::Maybe<int>,long>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe0,ERROR,
               "\"failed: expected \" \"\\\"-2147483648\\\"_kj.tryParseAs<int32_t>() == -2147483648\", _kjCondition"
               ,(char (*) [71])
                "failed: expected \"-2147483648\"_kj.tryParseAs<int32_t>() == -2147483648",
               (DebugComparison<kj::Maybe<int>,_long> *)&_kjCondition);
  }
  local_48.ptr = "2147483648";
  local_48.size_ = 0xb;
  StringPtr::tryParseAs<int>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr.field_1.value = (double)&none;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,local_58[0]) ^ 1;
  if ((local_58[0] != '\0') && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[67],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe1,ERROR,
               "\"failed: expected \" \"\\\"2147483648\\\"_kj.tryParseAs<int32_t>() == kj::none\", _kjCondition"
               ,(char (*) [67])
                "failed: expected \"2147483648\"_kj.tryParseAs<int32_t>() == kj::none",
               (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)&_kjCondition);
  }
  local_48.ptr = "-2147483649";
  local_48.size_ = 0xc;
  StringPtr::tryParseAs<int>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr.field_1.value = (double)&none;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,local_58[0]) ^ 1;
  if ((local_58[0] != '\0') && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[68],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe2,ERROR,
               "\"failed: expected \" \"\\\"-2147483649\\\"_kj.tryParseAs<int32_t>() == kj::none\", _kjCondition"
               ,(char (*) [68])
                "failed: expected \"-2147483649\"_kj.tryParseAs<int32_t>() == kj::none",
               (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58._4_4_ == 1;
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr.field_1._0_4_ = 1;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_int>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe4,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint32_t>() == 1\", _kjCondition",
               (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<uint32_t>() == 1",
               (DebugComparison<kj::Maybe<unsigned_int>,_int> *)&_kjCondition);
  }
  local_48.ptr = "0";
  local_48.size_ = 2;
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58._4_4_ == 0;
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr.field_1.value = _kjCondition.left.ptr.field_1.value & 0xffffffff00000000;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[53],kj::_::DebugComparison<kj::Maybe<unsigned_int>,unsigned_int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe5,ERROR,
               "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<uint32_t>() == 0U\", _kjCondition",
               (char (*) [53])"failed: expected \"0\"_kj.tryParseAs<uint32_t>() == 0U",
               (DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> *)&_kjCondition);
  }
  local_48.ptr = "4294967295";
  local_48.size_ = 0xb;
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58._4_4_ == -1;
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr.field_1._0_4_ = 0xffffffff;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[71],kj::_::DebugComparison<kj::Maybe<unsigned_int>,unsigned_int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe6,ERROR,
               "\"failed: expected \" \"\\\"4294967295\\\"_kj.tryParseAs<uint32_t>() == 4294967295U\", _kjCondition"
               ,(char (*) [71])
                "failed: expected \"4294967295\"_kj.tryParseAs<uint32_t>() == 4294967295U",
               (DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> *)&_kjCondition);
  }
  local_48.ptr = "-1";
  local_48.size_ = 3;
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr.field_1.value = (double)&none;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,local_58[0]) ^ 1;
  if ((local_58[0] != '\0') && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<unsigned_int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe7,ERROR,
               "\"failed: expected \" \"\\\"-1\\\"_kj.tryParseAs<uint32_t>() == kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected \"-1\"_kj.tryParseAs<uint32_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> *)&_kjCondition);
  }
  local_48.ptr = "4294967296";
  local_48.size_ = 0xb;
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr.field_1.value = (double)&none;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,local_58[0]) ^ 1;
  if ((local_58[0] != '\0') && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[68],kj::_::DebugComparison<kj::Maybe<unsigned_int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe8,ERROR,
               "\"failed: expected \" \"\\\"4294967296\\\"_kj.tryParseAs<uint32_t>() == kj::none\", _kjCondition"
               ,(char (*) [68])
                "failed: expected \"4294967296\"_kj.tryParseAs<uint32_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<short>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58._2_2_ == 1;
    _kjCondition.left.ptr._2_2_ = local_58._2_2_;
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr._4_4_ = 1;
  _kjCondition.left.ptr.field_1.value = (double)anon_var_dwarf_1b07e;
  _kjCondition.right = 2.47032822920623e-323;
  _kjCondition.op.content.ptr = (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<short>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xea,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int16_t>() == 1\", _kjCondition",
               (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<int16_t>() == 1",
               (DebugComparison<kj::Maybe<short>,_int> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<unsigned_short>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58._2_2_ == 1;
    _kjCondition.left.ptr._2_2_ = local_58._2_2_;
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr._4_4_ = 1;
  _kjCondition.left.ptr.field_1.value = (double)anon_var_dwarf_1b07e;
  _kjCondition.right = 2.47032822920623e-323;
  _kjCondition.op.content.ptr = (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_short>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xeb,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint16_t>() == 1\", _kjCondition",
               (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<uint16_t>() == 1",
               (DebugComparison<kj::Maybe<unsigned_short>,_int> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<signed_char>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58[1] == '\x01';
    _kjCondition.left.ptr._1_1_ = local_58[1];
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr._4_4_ = 1;
  _kjCondition.left.ptr.field_1.value = (double)anon_var_dwarf_1b07e;
  _kjCondition.right = 2.47032822920623e-323;
  _kjCondition.op.content.ptr = (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::Maybe<signed_char>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xec,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int8_t>() == 1\", _kjCondition",
               (char (*) [50])"failed: expected \"1\"_kj.tryParseAs<int8_t>() == 1",
               (DebugComparison<kj::Maybe<signed_char>,_int> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<unsigned_char>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58[1] == '\x01';
    _kjCondition.left.ptr._1_1_ = local_58[1];
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr._4_4_ = 1;
  _kjCondition.left.ptr.field_1.value = (double)anon_var_dwarf_1b07e;
  _kjCondition.right = 2.47032822920623e-323;
  _kjCondition.op.content.ptr = (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<unsigned_char>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xed,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint8_t>() == 1\", _kjCondition",
               (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<uint8_t>() == 1",
               (DebugComparison<kj::Maybe<unsigned_char>,_int> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<char>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58[1] == '\x01';
    _kjCondition.left.ptr._1_1_ = local_58[1];
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr._4_4_ = 1;
  _kjCondition.left.ptr.field_1.value = (double)anon_var_dwarf_1b07e;
  _kjCondition.right = 2.47032822920623e-323;
  _kjCondition.op.content.ptr = (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[48],kj::_::DebugComparison<kj::Maybe<char>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xee,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<char>() == 1\", _kjCondition",
               (char (*) [48])"failed: expected \"1\"_kj.tryParseAs<char>() == 1",
               (DebugComparison<kj::Maybe<char>,_int> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<signed_char>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58[1] == '\x01';
    _kjCondition.left.ptr._1_1_ = local_58[1];
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr._4_4_ = 1;
  _kjCondition.left.ptr.field_1.value = (double)anon_var_dwarf_1b07e;
  _kjCondition.right = 2.47032822920623e-323;
  _kjCondition.op.content.ptr = (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<signed_char>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xef,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<signed char>() == 1\", _kjCondition"
               ,(char (*) [55])"failed: expected \"1\"_kj.tryParseAs<signed char>() == 1",
               (DebugComparison<kj::Maybe<signed_char>,_int> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<unsigned_char>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58[1] == '\x01';
    _kjCondition.left.ptr._1_1_ = local_58[1];
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr._4_4_ = 1;
  _kjCondition.left.ptr.field_1.value = (double)anon_var_dwarf_1b07e;
  _kjCondition.right = 2.47032822920623e-323;
  _kjCondition.op.content.ptr = (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<unsigned_char>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf0,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned char>() == 1\", _kjCondition"
               ,(char (*) [57])"failed: expected \"1\"_kj.tryParseAs<unsigned char>() == 1",
               (DebugComparison<kj::Maybe<unsigned_char>,_int> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<short>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58._2_2_ == 1;
    _kjCondition.left.ptr._2_2_ = local_58._2_2_;
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr._4_4_ = 1;
  _kjCondition.left.ptr.field_1.value = (double)anon_var_dwarf_1b07e;
  _kjCondition.right = 2.47032822920623e-323;
  _kjCondition.op.content.ptr = (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<short>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf1,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<short>() == 1\", _kjCondition",
               (char (*) [49])"failed: expected \"1\"_kj.tryParseAs<short>() == 1",
               (DebugComparison<kj::Maybe<short>,_int> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<unsigned_short>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58._2_2_ == 1;
    _kjCondition.left.ptr._2_2_ = local_58._2_2_;
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr._4_4_ = 1;
  _kjCondition.left.ptr.field_1.value = (double)anon_var_dwarf_1b07e;
  _kjCondition.right = 2.47032822920623e-323;
  _kjCondition.op.content.ptr = (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<unsigned_short>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf2,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned short>() == 1\", _kjCondition"
               ,(char (*) [58])"failed: expected \"1\"_kj.tryParseAs<unsigned short>() == 1",
               (DebugComparison<kj::Maybe<unsigned_short>,_int> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<int>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58._4_4_ == 1;
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr.field_1._0_4_ = 1;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<int>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf3,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int>() == 1\", _kjCondition",
               (char (*) [47])"failed: expected \"1\"_kj.tryParseAs<int>() == 1",
               (DebugComparison<kj::Maybe<int>,_int> *)&_kjCondition);
  }
  local_48.ptr = "1";
  local_48.size_ = 2;
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_58);
  if (local_58[0] == '\x01') {
    bVar2 = local_58._4_4_ == 1;
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  _kjCondition.left.ptr.field_1._0_4_ = 1;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar2);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_int>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf4,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned>() == 1\", _kjCondition",
               (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<unsigned>() == 1",
               (DebugComparison<kj::Maybe<unsigned_int>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1bf183;
  local_50 = 2;
  StringPtr::tryParseAs<long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[48],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf5,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<long>() == 1\", _kjCondition",
               (char (*) [48])"failed: expected \"1\"_kj.tryParseAs<long>() == 1",
               (DebugComparison<kj::Maybe<long>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1bf183;
  local_50 = 2;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<unsigned_long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf6,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned long>() == 1\", _kjCondition"
               ,(char (*) [57])"failed: expected \"1\"_kj.tryParseAs<unsigned long>() == 1",
               (DebugComparison<kj::Maybe<unsigned_long>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1bf183;
  local_50 = 2;
  StringPtr::tryParseAs<long_long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[53],kj::_::DebugComparison<kj::Maybe<long_long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf7,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<long long>() == 1\", _kjCondition",
               (char (*) [53])"failed: expected \"1\"_kj.tryParseAs<long long>() == 1",
               (DebugComparison<kj::Maybe<long_long>,_int> *)&_kjCondition);
  }
  local_58 = (undefined1  [8])0x1bf183;
  local_50 = 2;
  StringPtr::tryParseAs<unsigned_long_long>((StringPtr *)&local_48);
  bVar2 = (byte)local_48.ptr == '\x01';
  if (bVar2) {
    _kjCondition.left.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_;
  }
  _kjCondition.result =
       bVar2 && (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ ==
                (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
  _kjCondition.left.ptr.isSet = (bool)(byte)local_48.ptr;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!bVar2 || (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_48.size_ !=
                 (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[62],kj::_::DebugComparison<kj::Maybe<unsigned_long_long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf8,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned long long>() == 1\", _kjCondition"
               ,(char (*) [62])"failed: expected \"1\"_kj.tryParseAs<unsigned long long>() == 1",
               (DebugComparison<kj::Maybe<unsigned_long_long>,_int> *)&_kjCondition);
  }
  heapString((String *)&local_48,"1");
  String::tryParseAs<int>((String *)local_58);
  _kjCondition.left.ptr.isSet = (bool)local_58[0];
  if (local_58[0] == '\x01') {
    _kjCondition.left.ptr._4_4_ = local_58._4_4_;
    local_58 = (undefined1  [8])((ulong)local_58 & 0xffffffffffffff00);
    bVar2 = _kjCondition.left.ptr._4_4_ == 1;
  }
  else {
    bVar2 = false;
  }
  _kjCondition.left.ptr.field_1._0_4_ = 1;
  _kjCondition.right = (double)anon_var_dwarf_1b07e;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar2);
  Array<char>::~Array(&local_48);
  if ((bVar2 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<int>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xfa,ERROR,
               "\"failed: expected \" \"heapString(\\\"1\\\").tryParseAs<int>() == 1\", _kjCondition"
               ,(char (*) [56])"failed: expected heapString(\"1\").tryParseAs<int>() == 1",
               (DebugComparison<kj::Maybe<int>,_int> *)&_kjCondition);
  }
  return;
}

Assistant:

TEST(String, tryParseAs) {
  KJ_EXPECT("0"_kj.tryParseAs<double>() == 0.0);
  KJ_EXPECT("0"_kj.tryParseAs<double>() == 0.0);
  KJ_EXPECT("0.0"_kj.tryParseAs<double>() == 0.0);
  KJ_EXPECT("1"_kj.tryParseAs<double>() == 1.0);
  KJ_EXPECT("1.0"_kj.tryParseAs<double>() == 1.0);
  KJ_EXPECT("1e100"_kj.tryParseAs<double>() == 1e100);
  KJ_EXPECT("inf"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("infinity"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("INF"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("INFINITY"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("1e100000"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("-inf"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-infinity"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-INF"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-INFINITY"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-1e100000"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT(isNaN("nan"_kj.tryParseAs<double>().orDefault(0.0)) == true);
  KJ_EXPECT(isNaN("NAN"_kj.tryParseAs<double>().orDefault(0.0)) == true);
  KJ_EXPECT(isNaN("NaN"_kj.tryParseAs<double>().orDefault(0.0)) == true);
  KJ_EXPECT(""_kj.tryParseAs<double>() == kj::none);
  KJ_EXPECT("a"_kj.tryParseAs<double>() == kj::none);
  KJ_EXPECT("1a"_kj.tryParseAs<double>() == kj::none);
  KJ_EXPECT("+-1"_kj.tryParseAs<double>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<float>() == 1.0);

  KJ_EXPECT("1"_kj.tryParseAs<int64_t>() == 1);
  KJ_EXPECT("9223372036854775807"_kj.tryParseAs<int64_t>() == 9223372036854775807LL);
  KJ_EXPECT("-9223372036854775808"_kj.tryParseAs<int64_t>() == -9223372036854775808ULL);
  KJ_EXPECT("9223372036854775808"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("-9223372036854775809"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT(""_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("a"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("1a"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("+-1"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("010"_kj.tryParseAs<int64_t>() == 10);
  KJ_EXPECT("0010"_kj.tryParseAs<int64_t>() == 10);
  KJ_EXPECT("0x10"_kj.tryParseAs<int64_t>() == 16);
  KJ_EXPECT("0X10"_kj.tryParseAs<int64_t>() == 16);
  KJ_EXPECT("-010"_kj.tryParseAs<int64_t>() == -10);
  KJ_EXPECT("-0x10"_kj.tryParseAs<int64_t>() == -16);
  KJ_EXPECT("-0X10"_kj.tryParseAs<int64_t>() == -16);

  KJ_EXPECT("1"_kj.tryParseAs<uint64_t>() == 1);
  KJ_EXPECT("0"_kj.tryParseAs<uint64_t>() == 0);
  KJ_EXPECT("18446744073709551615"_kj.tryParseAs<uint64_t>() == 18446744073709551615ULL);
  KJ_EXPECT("-1"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("18446744073709551616"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT(""_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("a"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("1a"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("+-1"_kj.tryParseAs<uint64_t>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<int32_t>() == 1);
  KJ_EXPECT("2147483647"_kj.tryParseAs<int32_t>() == 2147483647);
  KJ_EXPECT("-2147483648"_kj.tryParseAs<int32_t>() == -2147483648);
  KJ_EXPECT("2147483648"_kj.tryParseAs<int32_t>() == kj::none);
  KJ_EXPECT("-2147483649"_kj.tryParseAs<int32_t>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<uint32_t>() == 1);
  KJ_EXPECT("0"_kj.tryParseAs<uint32_t>() == 0U);
  KJ_EXPECT("4294967295"_kj.tryParseAs<uint32_t>() == 4294967295U);
  KJ_EXPECT("-1"_kj.tryParseAs<uint32_t>() == kj::none);
  KJ_EXPECT("4294967296"_kj.tryParseAs<uint32_t>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<int16_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<uint16_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<int8_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<uint8_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<char>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<signed char>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned char>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<short>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned short>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<int>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<long>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned long>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<long long>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned long long>() == 1);

  KJ_EXPECT(heapString("1").tryParseAs<int>() == 1);
}